

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdAddTargetAmountForFundRawTx
              (void *handle,void *fund_handle,uint32_t asset_index,int64_t amount,char *asset,
              char *reserved_address)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  undefined8 uVar4;
  undefined8 in_RCX;
  uint in_EDX;
  long in_RSI;
  char *in_R8;
  char *in_R9;
  CfdException *except;
  exception *std_except;
  CfdCapiFundTargetAmount object;
  CfdCapiFundRawTxData *buffer;
  int result;
  CfdCapiFundTargetAmount *in_stack_fffffffffffffe68;
  CfdCapiFundTargetAmount *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  CfdError error_code;
  allocator *paVar5;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  allocator local_129;
  string local_128 [32];
  string local_108 [32];
  undefined8 local_e8;
  string local_e0 [38];
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  char *local_98;
  int local_90;
  string *in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  allocator local_71;
  string local_70 [52];
  undefined4 local_3c;
  char *local_38;
  char *local_30;
  undefined8 local_28;
  uint local_1c;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  local_3c = 0xffffffff;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"FundRawTxData",&local_71);
  cfd::capi::CheckBuffer(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  if (*(long *)(local_18 + 0x58) != 0) {
    uVar2 = (ulong)local_1c;
    sVar3 = std::
            vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
            ::size(*(vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
                     **)(local_18 + 0x58));
    if (uVar2 < sVar3) {
      cfd::capi::CfdCapiFundTargetAmount::CfdCapiFundTargetAmount(in_stack_fffffffffffffe70);
      local_e8 = local_28;
      std::__cxx11::string::operator=(local_e0,local_38);
      bVar1 = cfd::capi::IsEmptyString(local_30);
      if (!bVar1) {
        paVar5 = &local_129;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_128,local_30,paVar5);
        std::__cxx11::string::operator=(local_108,local_128);
        std::__cxx11::string::~string(local_128);
        std::allocator<char>::~allocator((allocator<char> *)&local_129);
      }
      std::
      vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
      ::operator[](*(vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
                     **)(local_18 + 0x58),(ulong)local_1c);
      cfd::capi::CfdCapiFundTargetAmount::operator=
                (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      local_4 = 0;
      cfd::capi::CfdCapiFundTargetAmount::~CfdCapiFundTargetAmount(in_stack_fffffffffffffe70);
      return local_4;
    }
  }
  local_98 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                     ,0x2f);
  local_98 = local_98 + 1;
  local_90 = 0xc4c;
  cfd::core::logger::warn<>((CfdSourceLocation *)&local_98,"target amounts is maximum over.");
  local_ba = 1;
  uVar4 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b8,"Failed to parameter. target amounts is maximum over.",&local_b9);
  cfd::core::CfdException::CfdException
            ((CfdException *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
             error_code,in_stack_fffffffffffffe80);
  local_ba = 0;
  __cxa_throw(uVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddTargetAmountForFundRawTx(
    void* handle, void* fund_handle, uint32_t asset_index, int64_t amount,
    const char* asset, const char* reserved_address) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(fund_handle, kPrefixFundRawTxData);
    /*
    if (IsEmptyString(reserved_address)) {
      warn(CFD_LOG_SOURCE, "reserved_address is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. reserved_address is null.");
    }
    */

    CfdCapiFundRawTxData* buffer =
        static_cast<CfdCapiFundRawTxData*>(fund_handle);
    if ((buffer->targets == nullptr) ||
        (asset_index >= buffer->targets->size())) {
      warn(CFD_LOG_SOURCE, "target amounts is maximum over.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. target amounts is maximum over.");
    }

    CfdCapiFundTargetAmount object;
    object.amount = amount;
    object.reserved_address = reserved_address;
    if (!IsEmptyString(asset)) {
#ifndef CFD_DISABLE_ELEMENTS
      object.asset = std::string(asset);
#endif  // CFD_DISABLE_ELEMENTS
    }

    (*buffer->targets)[asset_index] = object;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}